

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O0

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  allocator_type *paVar3;
  undefined8 *in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  float fVar4;
  int i_8;
  float scale_3;
  int i_7;
  float scale_2;
  int i_6;
  float scale_1;
  int i_5;
  float scale;
  float val_1;
  int k_1;
  float sum_1;
  float *sptr_1;
  int j_2;
  int i_4;
  float *outptr_1;
  Mat m_1;
  int q_3;
  float val;
  int k;
  float max_1;
  float *sptr;
  int j_1;
  int i_3;
  float *outptr;
  Mat m;
  int q_2;
  int j;
  int i_2;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  Option opt_b_3;
  int hpad_1;
  int wpad_1;
  Option opt_b_2;
  int hpad;
  int wpad;
  Option opt_b_1;
  Option opt_b;
  int htail;
  int wtail;
  int htailpad;
  int wtailpad;
  float pad_value;
  Mat bottom_blob_bordered;
  int i_1;
  float sum;
  float *ptr_1;
  int q_1;
  int i;
  float max;
  float *ptr;
  int q;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffa80;
  Mat *in_stack_fffffffffffffa88;
  allocator_type *in_stack_fffffffffffffa90;
  size_type in_stack_fffffffffffffa98;
  Mat *in_stack_fffffffffffffaa0;
  int local_4c4;
  Mat local_4c0;
  float local_480;
  int local_47c;
  Mat local_478;
  float local_438;
  int local_434;
  Mat local_430;
  float local_3f0;
  int local_3ec;
  Mat local_3e8;
  float local_3a8;
  float local_3a4;
  int local_3a0;
  float local_39c;
  float *local_398;
  int local_390;
  int local_38c;
  Mat local_388;
  allocator_type *local_348;
  Mat local_340;
  int local_300;
  float local_2fc;
  int local_2f8;
  float local_2f4;
  float *local_2f0;
  int local_2e8;
  int local_2e4;
  Mat local_2e0;
  float *local_2a0;
  Mat local_298;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  int local_248;
  int local_244;
  reference local_240;
  vector<int,_std::allocator<int>_> local_230;
  int local_214;
  int local_210;
  int local_20c;
  undefined1 local_208 [48];
  undefined1 local_1d8 [48];
  undefined1 local_1a8 [48];
  Mat local_178;
  Mat local_138;
  int local_f8;
  float local_f4;
  Mat local_f0;
  float *local_b0;
  int local_a8;
  int local_a4;
  float local_a0 [4];
  Mat local_90;
  float *local_50;
  int local_48;
  int local_44;
  size_t local_40;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  Mat *local_20;
  int local_4;
  
  local_2c = in_RSI->w;
  local_30 = in_RSI->h;
  local_34 = in_RSI->c;
  local_40 = in_RSI->elemsize;
  if (*(int *)(in_RDI + 0xa4) != 0) {
    local_20 = in_RDX;
    Mat::create(in_stack_fffffffffffffaa0,(int)(in_stack_fffffffffffffa98 >> 0x20),
                (size_t)in_stack_fffffffffffffa90,(Allocator *)in_stack_fffffffffffffa88);
    bVar1 = Mat::empty(in_stack_fffffffffffffa80);
    if (!bVar1) {
      local_44 = local_2c * local_30;
      if (*(int *)(in_RDI + 0x80) == 0) {
        for (local_48 = 0; local_48 < local_34; local_48 = local_48 + 1) {
          Mat::channel(in_stack_fffffffffffffa88,(int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_90);
          Mat::~Mat((Mat *)0x14bbbb);
          local_a0[0] = *pfVar2;
          local_50 = pfVar2;
          for (local_a4 = 0; fVar4 = local_a0[0], local_a4 < local_44; local_a4 = local_a4 + 1) {
            pfVar2 = std::max<float>(local_a0,local_50 + local_a4);
            local_a0[0] = *pfVar2;
          }
          pfVar2 = Mat::operator[](local_20,local_48);
          *pfVar2 = fVar4;
        }
      }
      else if (*(int *)(in_RDI + 0x80) == 1) {
        for (local_a8 = 0; local_a8 < local_34; local_a8 = local_a8 + 1) {
          Mat::channel(in_stack_fffffffffffffa88,(int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_f0);
          Mat::~Mat((Mat *)0x14bd2f);
          local_f4 = 0.0;
          for (local_f8 = 0; local_f8 < local_44; local_f8 = local_f8 + 1) {
            local_f4 = pfVar2[local_f8] + local_f4;
          }
          fVar4 = local_f4 / (float)local_44;
          local_b0 = pfVar2;
          pfVar2 = Mat::operator[](local_20,local_a8);
          *pfVar2 = fVar4;
        }
      }
      return 0;
    }
    return -100;
  }
  local_28 = in_RCX;
  Mat::Mat(&local_138,in_RSI);
  if (*(int *)(in_RDI + 0x80) == 0) {
    local_178.cstep._4_4_ = 0xff7fffff;
  }
  else {
    local_178.cstep._4_4_ = 0;
  }
  local_178.cstep._0_4_ = 0;
  local_178.c = 0;
  if (*(int *)(in_RDI + 0xa8) == 0) {
    local_178.h = ((local_2c + *(int *)(in_RDI + 0x94) + *(int *)(in_RDI + 0x98)) -
                  *(int *)(in_RDI + 0x84)) % *(int *)(in_RDI + 0x8c);
    local_178.w = ((local_30 + *(int *)(in_RDI + 0x9c) + *(int *)(in_RDI + 0xa0)) -
                  *(int *)(in_RDI + 0x88)) % *(int *)(in_RDI + 0x90);
    if (local_178.h != 0) {
      local_178.cstep._0_4_ = *(int *)(in_RDI + 0x8c) - local_178.h;
    }
    if (local_178.w != 0) {
      local_178.c = *(int *)(in_RDI + 0x90) - local_178.w;
    }
    local_178.allocator = (Allocator *)local_28[4];
    local_178.data = (void *)*local_28;
    local_178.elemsize = local_28[2];
    local_178._24_8_ = local_28[3];
    local_178.refcount = (int *)local_28[2];
    in_stack_fffffffffffffa80 = &local_178;
    copy_make_border((Mat *)opt_b_2.workspace_allocator,(Mat *)opt_b_2.blob_allocator,
                     opt_b_2.num_threads,opt_b_2._0_4_,wpad_1,hpad_1,opt_b_2._32_4_,
                     (float)opt_b_3._36_4_,_hpad);
    bVar1 = Mat::empty(in_stack_fffffffffffffa80);
    if (bVar1) {
      local_4 = -100;
      local_1a8._44_4_ = 1;
      goto LAB_0014d190;
    }
    local_2c = local_138.w;
    local_30 = local_138.h;
  }
  else if (*(int *)(in_RDI + 0xa8) == 1) {
    local_1a8._32_8_ = local_28[4];
    local_1a8._0_8_ = *local_28;
    local_1a8._16_8_ = local_28[2];
    local_1a8._24_8_ = local_28[3];
    local_1a8._8_8_ = local_28[2];
    in_stack_fffffffffffffa80 = (Mat *)local_1a8;
    copy_make_border((Mat *)opt_b_2.workspace_allocator,(Mat *)opt_b_2.blob_allocator,
                     opt_b_2.num_threads,opt_b_2._0_4_,wpad_1,hpad_1,opt_b_2._32_4_,
                     (float)opt_b_3._36_4_,_hpad);
    bVar1 = Mat::empty(in_stack_fffffffffffffa80);
    if (bVar1) {
      local_4 = -100;
      local_1a8._44_4_ = 1;
      goto LAB_0014d190;
    }
    local_2c = local_138.w;
    local_30 = local_138.h;
  }
  else if (*(int *)(in_RDI + 0xa8) == 2) {
    local_1d8._44_4_ =
         (*(int *)(in_RDI + 0x84) +
         ((local_2c + -1) / *(int *)(in_RDI + 0x8c)) * *(int *)(in_RDI + 0x8c)) - local_2c;
    local_1d8._40_4_ =
         (*(int *)(in_RDI + 0x88) +
         ((local_30 + -1) / *(int *)(in_RDI + 0x90)) * *(int *)(in_RDI + 0x90)) - local_30;
    if ((0 < (int)local_1d8._44_4_) || (0 < (int)local_1d8._40_4_)) {
      local_1d8._32_8_ = local_28[4];
      local_1d8._0_8_ = *local_28;
      local_1d8._16_8_ = local_28[2];
      local_1d8._24_8_ = local_28[3];
      local_1d8._8_8_ = local_28[2];
      in_stack_fffffffffffffa80 = (Mat *)local_1d8;
      copy_make_border((Mat *)opt_b_2.workspace_allocator,(Mat *)opt_b_2.blob_allocator,
                       opt_b_2.num_threads,opt_b_2._0_4_,wpad_1,hpad_1,opt_b_2._32_4_,
                       (float)opt_b_3._36_4_,_hpad);
      bVar1 = Mat::empty(in_stack_fffffffffffffa80);
      if (bVar1) {
        local_4 = -100;
        local_1a8._44_4_ = 1;
        goto LAB_0014d190;
      }
    }
    local_2c = local_138.w;
    local_30 = local_138.h;
  }
  else if (*(int *)(in_RDI + 0xa8) == 3) {
    local_208._44_4_ =
         (*(int *)(in_RDI + 0x84) +
         ((local_2c + -1) / *(int *)(in_RDI + 0x8c)) * *(int *)(in_RDI + 0x8c)) - local_2c;
    local_208._40_4_ =
         (*(int *)(in_RDI + 0x88) +
         ((local_30 + -1) / *(int *)(in_RDI + 0x90)) * *(int *)(in_RDI + 0x90)) - local_30;
    if ((0 < (int)local_208._44_4_) || (0 < (int)local_208._40_4_)) {
      local_208._32_8_ = local_28[4];
      local_208._0_8_ = *local_28;
      local_208._16_8_ = local_28[2];
      local_208._24_8_ = local_28[3];
      local_208._8_8_ = local_28[2];
      in_stack_fffffffffffffa80 = (Mat *)local_208;
      copy_make_border((Mat *)opt_b_2.workspace_allocator,(Mat *)opt_b_2.blob_allocator,
                       opt_b_2.num_threads,opt_b_2._0_4_,wpad_1,hpad_1,opt_b_2._32_4_,
                       (float)opt_b_3._36_4_,_hpad);
      bVar1 = Mat::empty(in_stack_fffffffffffffa80);
      if (bVar1) {
        local_4 = -100;
        local_1a8._44_4_ = 1;
        goto LAB_0014d190;
      }
    }
    local_2c = local_138.w;
    local_30 = local_138.h;
  }
  local_20c = (local_2c - *(int *)(in_RDI + 0x84)) / *(int *)(in_RDI + 0x8c) + 1;
  local_210 = (local_30 - *(int *)(in_RDI + 0x88)) / *(int *)(in_RDI + 0x90) + 1;
  Mat::create(in_stack_fffffffffffffaa0,(int)(in_stack_fffffffffffffa98 >> 0x20),
              (int)in_stack_fffffffffffffa98,(int)((ulong)in_stack_fffffffffffffa90 >> 0x20),
              (size_t)in_stack_fffffffffffffa88,(Allocator *)in_stack_fffffffffffffa80);
  bVar1 = Mat::empty(in_stack_fffffffffffffa80);
  if (bVar1) {
    local_4 = -100;
    local_1a8._44_4_ = 1;
  }
  else {
    local_214 = *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x88);
    std::allocator<int>::allocator((allocator<int> *)0x14c5e4);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffaa0,
               in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
    std::allocator<int>::~allocator((allocator<int> *)0x14c60a);
    local_240 = std::vector<int,_std::allocator<int>_>::operator[](&local_230,0);
    local_244 = 0;
    local_248 = 0;
    local_24c = local_2c - *(int *)(in_RDI + 0x84);
    for (local_250 = 0; local_250 < *(int *)(in_RDI + 0x88); local_250 = local_250 + 1) {
      for (local_254 = 0; local_254 < *(int *)(in_RDI + 0x84); local_254 = local_254 + 1) {
        local_240[local_244] = local_248;
        local_244 = local_244 + 1;
        local_248 = local_248 + 1;
      }
      local_248 = local_24c + local_248;
    }
    if (*(int *)(in_RDI + 0x80) == 0) {
      for (local_258 = 0; local_258 < local_34; local_258 = local_258 + 1) {
        Mat::channel(in_stack_fffffffffffffa88,(int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
        Mat::channel(in_stack_fffffffffffffa88,(int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_2e0);
        Mat::~Mat((Mat *)0x14c7ce);
        local_2a0 = pfVar2;
        for (local_2e4 = 0; local_2e4 < local_210; local_2e4 = local_2e4 + 1) {
          for (local_2e8 = 0; local_2e8 < local_20c; local_2e8 = local_2e8 + 1) {
            local_2f0 = Mat::row(&local_298,local_2e4 * *(int *)(in_RDI + 0x90));
            local_2f0 = local_2f0 + local_2e8 * *(int *)(in_RDI + 0x8c);
            local_2f4 = *local_2f0;
            for (local_2f8 = 0; local_2f8 < local_214; local_2f8 = local_2f8 + 1) {
              local_2fc = local_2f0[local_240[local_2f8]];
              pfVar2 = std::max<float>(&local_2f4,&local_2fc);
              local_2f4 = *pfVar2;
            }
            local_2a0[local_2e8] = local_2f4;
          }
          local_2a0 = local_2a0 + local_20c;
        }
        Mat::~Mat((Mat *)0x14c9e1);
      }
    }
    else if (*(int *)(in_RDI + 0x80) == 1) {
      for (local_300 = 0; local_300 < local_34; local_300 = local_300 + 1) {
        Mat::channel(in_stack_fffffffffffffa88,(int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
        Mat::channel(in_stack_fffffffffffffa88,(int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
        paVar3 = (allocator_type *)Mat::operator_cast_to_float_(&local_388);
        Mat::~Mat((Mat *)0x14ca9f);
        local_348 = paVar3;
        for (local_38c = 0; local_38c < local_210; local_38c = local_38c + 1) {
          for (local_390 = 0; local_390 < local_20c; local_390 = local_390 + 1) {
            local_398 = Mat::row(&local_340,local_38c * *(int *)(in_RDI + 0x90));
            local_398 = local_398 + local_390 * *(int *)(in_RDI + 0x8c);
            local_39c = 0.0;
            for (local_3a0 = 0; local_3a0 < local_214; local_3a0 = local_3a0 + 1) {
              local_3a4 = local_398[local_240[local_3a0]];
              local_39c = local_3a4 + local_39c;
            }
            *(float *)(local_348 + (long)local_390 * 4) = local_39c / (float)local_214;
          }
          local_348 = local_348 + (long)local_20c * 4;
        }
        if (*(int *)(in_RDI + 0xac) == 0) {
          if (*(int *)(in_RDI + 0x9c) != 0) {
            local_3a8 = (float)*(int *)(in_RDI + 0x88) /
                        (float)(*(int *)(in_RDI + 0x88) - *(int *)(in_RDI + 0x9c));
            Mat::channel(in_stack_fffffffffffffa88,(int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
            local_348 = (allocator_type *)Mat::row(&local_3e8,0);
            Mat::~Mat((Mat *)0x14cd20);
            for (local_3ec = 0; local_3ec < local_20c; local_3ec = local_3ec + 1) {
              *(float *)(local_348 + (long)local_3ec * 4) =
                   local_3a8 * *(float *)(local_348 + (long)local_3ec * 4);
            }
          }
          if (*(int *)(in_RDI + 0xa0) + local_178.c != 0) {
            local_3f0 = (float)*(int *)(in_RDI + 0x88) /
                        (float)((*(int *)(in_RDI + 0x88) - *(int *)(in_RDI + 0xa0)) - local_178.c);
            Mat::channel(in_stack_fffffffffffffa88,(int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
            local_348 = (allocator_type *)Mat::row(&local_430,local_210 + -1);
            Mat::~Mat((Mat *)0x14ce40);
            for (local_434 = 0; local_434 < local_20c; local_434 = local_434 + 1) {
              *(float *)(local_348 + (long)local_434 * 4) =
                   local_3f0 * *(float *)(local_348 + (long)local_434 * 4);
            }
          }
          if (*(int *)(in_RDI + 0x94) != 0) {
            local_438 = (float)*(int *)(in_RDI + 0x84) /
                        (float)(*(int *)(in_RDI + 0x84) - *(int *)(in_RDI + 0x94));
            Mat::channel(in_stack_fffffffffffffa88,(int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
            local_348 = (allocator_type *)Mat::operator_cast_to_float_(&local_478);
            Mat::~Mat((Mat *)0x14cf45);
            for (local_47c = 0; local_47c < local_210; local_47c = local_47c + 1) {
              *(float *)local_348 = local_438 * *(float *)local_348;
              local_348 = local_348 + (long)local_20c * 4;
            }
          }
          if (*(int *)(in_RDI + 0x98) + (int)local_178.cstep != 0) {
            local_480 = (float)*(int *)(in_RDI + 0x84) /
                        (float)((*(int *)(in_RDI + 0x84) - *(int *)(in_RDI + 0x98)) -
                               (int)local_178.cstep);
            Mat::channel(in_stack_fffffffffffffa88,(int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
            in_stack_fffffffffffffa90 = (allocator_type *)Mat::operator_cast_to_float_(&local_4c0);
            local_348 = in_stack_fffffffffffffa90;
            Mat::~Mat((Mat *)0x14d073);
            local_348 = local_348 + (long)(local_20c + -1) * 4;
            for (local_4c4 = 0; local_4c4 < local_210; local_4c4 = local_4c4 + 1) {
              *(float *)local_348 = local_480 * *(float *)local_348;
              local_348 = local_348 + (long)local_20c * 4;
            }
          }
        }
        Mat::~Mat((Mat *)0x14d133);
      }
    }
    local_4 = 0;
    local_1a8._44_4_ = 1;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa90);
  }
LAB_0014d190:
  Mat::~Mat((Mat *)0x14d19d);
  return local_4;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i=0; i<size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i=0; i<size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered = bottom_blob;

    float pad_value = 0.f;
    if (pooling_type == PoolMethod_MAX)
    {
        pad_value = -FLT_MAX;
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        pad_value = 0.f;
    }

    int wtailpad = 0;
    int htailpad = 0;

    if (pad_mode == 0) // full padding
    {
        int wtail = (w + pad_left + pad_right - kernel_w) % stride_w;
        int htail = (h + pad_top + pad_bottom - kernel_h) % stride_h;

        if (wtail != 0)
            wtailpad = stride_w - wtail;
        if (htail != 0)
            htailpad = stride_h - htail;

        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom + htailpad, pad_left, pad_right + wtailpad, BORDER_CONSTANT, pad_value, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 1) // valid padding
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 2) // tensorflow padding=SAME or onnx padding=SAME_UPPER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 3) // onnx padding=SAME_LOWER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float sum = 0;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        sum += val;
                    }

                    outptr[j] = sum / maxk;
                }

                outptr += outw;
            }

            if (avgpool_count_include_pad == 0)
            {
                // fix pad
                if (pad_top != 0)
                {
                    const float scale = (float)kernel_h / (kernel_h - pad_top);

                    outptr = top_blob.channel(q).row(0);
                    for (int i = 0; i < outw; i++)
                    {
                        outptr[i] *= scale;
                    }
                }
                if (pad_bottom + htailpad != 0)
                {
                    const float scale = (float)kernel_h / (kernel_h - pad_bottom - htailpad);

                    outptr = top_blob.channel(q).row(outh - 1);
                    for (int i = 0; i < outw; i++)
                    {
                        outptr[i] *= scale;
                    }
                }
                if (pad_left != 0)
                {
                    const float scale = (float)kernel_w / (kernel_w - pad_left);

                    outptr = top_blob.channel(q);
                    for (int i = 0; i < outh; i++)
                    {
                        *outptr *= scale;
                        outptr += outw;
                    }
                }
                if (pad_right + wtailpad != 0)
                {
                    const float scale = (float)kernel_w / (kernel_w - pad_right - wtailpad);

                    outptr = top_blob.channel(q);
                    outptr += outw - 1;
                    for (int i = 0; i < outh; i++)
                    {
                        *outptr *= scale;
                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}